

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

Bit32u MT32Emu::calcVeloMult(Bit8u veloSensitivity,uint velocity)

{
  undefined4 local_1c;
  uint scaledReversedVelocity;
  uint reversedVelocity;
  uint velocity_local;
  Bit8u veloSensitivity_local;
  
  if (veloSensitivity == '\0') {
    velocity_local = 0x5555;
  }
  else {
    if (veloSensitivity < 4) {
      local_1c = 0x7f - velocity << (veloSensitivity + 5 & 0x1f);
    }
    else {
      local_1c = (0x7f - velocity) * 0x100 >> (3 - veloSensitivity & 0x1f);
    }
    velocity_local = (0x8000 - local_1c) * 0x5555 >> 0xf;
  }
  return velocity_local;
}

Assistant:

static Bit32u calcVeloMult(Bit8u veloSensitivity, unsigned int velocity) {
	if (veloSensitivity == 0) {
		return 21845; // aka floor(4096 / 12 * 64), aka ~64 semitones
	}
	unsigned int reversedVelocity = 127 - velocity;
	unsigned int scaledReversedVelocity;
	if (veloSensitivity > 3) {
		// Note that on CM-32L/LAPC-I veloSensitivity is never > 3, since it's clipped to 3 by the max tables.
		// MT-32 GEN0 has a bug here that leads to unspecified behaviour. We assume it is as follows.
		scaledReversedVelocity = (reversedVelocity << 8) >> ((3 - veloSensitivity) & 0x1f);
	} else {
		scaledReversedVelocity = reversedVelocity << (5 + veloSensitivity);
	}
	// When velocity is 127, the multiplier is 21845, aka ~64 semitones (regardless of veloSensitivity).
	// The lower the velocity, the lower the multiplier. The veloSensitivity determines the amount decreased per velocity value.
	// The minimum multiplier on CM-32L/LAPC-I (with velocity 0, veloSensitivity 3) is 170 (~half a semitone).
	return ((32768 - scaledReversedVelocity) * 21845) >> 15;
}